

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition_table.cc
# Opt level: O0

void __thiscall
transition_table_update_existing_key_Test::TestBody(transition_table_update_existing_key_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  data_type *__t;
  __tuple_element_t<0UL,_tuple<Row<Transition<State<s1>,_Event<e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_State<s2>_>,_Transition<State<s1>,_Event<e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:57:31),_action_pass,_State<void>_>_>_>_>
  *this_00;
  data_type *pdVar3;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var4;
  char *pcVar5;
  char *in_R9;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  e3 local_138;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_100;
  Message local_f8;
  e3 local_f0;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__2;
  __tuple_element_t<1UL,_tuple<Transition<State<s1>,_Event<e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_State<s2>_>,_Transition<State<s1>,_Event<e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:57:31),_action_pass,_State<void>_>_>_>
  *transition_1;
  AssertHelper local_b0;
  Message local_a8;
  e3 local_a0;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_68;
  Message local_60 [3];
  e3 local_48;
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  __tuple_element_t<0UL,_tuple<Transition<State<s1>,_Event<e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_State<s2>_>,_Transition<State<s1>,_Event<e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:57:31),_action_pass,_State<void>_>_>_>
  *transition;
  __tuple_element_t<0UL,_tuple<Row<Transition<State<s1>,_Event<e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_State<s2>_>,_Transition<State<s1>,_Event<e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:57:31),_action_pass,_State<void>_>_>_>_>
  *row1;
  undefined1 local_17;
  undefined1 local_16 [3];
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>
  local_13;
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>_>_>
  tb2;
  transition local_11;
  transition_table_update_existing_key_Test *ptStack_10;
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>_>_>
  tb1;
  transition_table_update_existing_key_Test *this_local;
  
  ptStack_10 = this;
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__0,transition_table_update_existing_key_Test::TestBody()::__1,state_machine::transition::State<(anonymous_namespace)::s2>>
            (local_16,&local_17);
  state_machine::transition::
  make_row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__0,transition_table_update_existing_key_Test::TestBody()::__1,state_machine::transition::State<(anonymous_namespace)::s2>>>
            ((transition *)&tb2,&local_13);
  state_machine::transition::
  make_table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__0,transition_table_update_existing_key_Test::TestBody()::__1,state_machine::transition::State<(anonymous_namespace)::s2>>>>
            (&local_11,
             (Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>_>
              *)&tb2);
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__2,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,state_machine::containers::basic::identity<state_machine::transition::detail::empty>>
            ((long)&row1 + 2,&state_machine::placeholder::_);
  state_machine::transition::
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::$_0,transition_table_update_existing_key_Test::TestBody()::$_1,state_machine::transition::State<(anonymous_namespace)::s2>>>>
  ::
  update<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__2,state_machine::transition::detail::action_pass,state_machine::transition::State<void>>>
            ((Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__0,transition_table_update_existing_key_Test::TestBody()::__1,state_machine::transition::State<(anonymous_namespace)::s2>>>>
              *)((long)&row1 + 6),
             (Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
              *)&local_11);
  __t = state_machine::transition::
        Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:31),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>_>_>
        ::data((Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>_>_>
                *)((long)&row1 + 6));
  this_00 = std::
            get<0ul,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__0,transition_table_update_existing_key_Test::TestBody()::__1,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__2,state_machine::transition::detail::action_pass,state_machine::transition::State<void>>>>
                      (__t);
  pdVar3 = state_machine::transition::
           Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:31),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>_>
           ::data(this_00);
  _Var4.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )std::
         get<0ul,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__0,transition_table_update_existing_key_Test::TestBody()::__1,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__2,state_machine::transition::detail::action_pass,state_machine::transition::State<void>>>
                   (pdVar3);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var4.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  anon_unknown.dwarf_f07b::e3::e3(&local_48,1);
  local_41 = state_machine::transition::
             Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:31),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>
             ::guard<(anonymous_namespace)::e3>
                       ((Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>
                         *)_Var4.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,&local_48);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar2) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_40,
               (AssertionResult *)"transition.guard(e3{1})","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc"
               ,0x40,pcVar5);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  uVar1 = gtest_ar_.message_;
  anon_unknown.dwarf_f07b::e3::e3(&local_a0,0);
  local_99 = state_machine::transition::
             Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:31),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>
             ::guard<(anonymous_namespace)::e3>
                       ((Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>
                         *)uVar1._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,&local_a0);
  local_99 = !local_99;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&transition_1,(internal *)local_98,
               (AssertionResult *)"transition.guard(e3{0})","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc"
               ,0x41,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&transition_1);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  pdVar3 = state_machine::transition::
           Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:31),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:54:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>_>
           ::data(this_00);
  _Var4.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )std::
         get<1ul,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__0,transition_table_update_existing_key_Test::TestBody()::__1,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_update_existing_key_Test::TestBody()::__2,state_machine::transition::detail::action_pass,state_machine::transition::State<void>>>
                   (pdVar3);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var4.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  anon_unknown.dwarf_f07b::e3::e3(&local_f0,1);
  local_e9 = state_machine::transition::
             Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
             ::guard<(anonymous_namespace)::e3>
                       ((Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
                         *)_Var4.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,&local_f0);
  local_e9 = !local_e9;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_e8,
               (AssertionResult *)"transition.guard(e3{1})","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc"
               ,0x45,pcVar5);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  uVar1 = gtest_ar__2.message_;
  anon_unknown.dwarf_f07b::e3::e3(&local_138,0);
  local_131 = state_machine::transition::
              Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
              ::guard<(anonymous_namespace)::e3>
                        ((Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:57:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
                          *)uVar1._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,&local_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)local_130,(AssertionResult *)"transition.guard(e3{0})","false"
               ,"true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc"
               ,0x46,pcVar5);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  return;
}

Assistant:

TEST(transition_table, update_existing_key) {
    auto tb1 = make_table(make_row(make_transition(
        state<s1>, event<e3>, [](auto e) { return e.value > 0; }, [] { return s2{}; }, state<s2>)));

    auto tb2 = std::move(tb1).update(make_transition(
        state<s1>, event<e3>, [](auto e) { return e.value <= 0; }, _, _));

    static_assert(decltype(tb2)::size == 1, "");

    const auto& row1 = std::get<0>(tb2.data());
    {
        const auto& transition = std::get<0>(row1.data());
        EXPECT_TRUE(transition.guard(e3{1}));
        EXPECT_FALSE(transition.guard(e3{0}));
    }
    {
        const auto& transition = std::get<1>(row1.data());
        EXPECT_FALSE(transition.guard(e3{1}));
        EXPECT_TRUE(transition.guard(e3{0}));
    }
}